

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

ForeignMessage * __thiscall
proto2_unittest::TestAllTypes::release_optional_foreign_message(TestAllTypes *this)

{
  ForeignMessage *this_00;
  ulong uVar1;
  ForeignMessage *this_01;
  
  *(byte *)&this->field_0 = *(byte *)&this->field_0 & 0xbf;
  this_00 = (this->field_0)._impl_.optional_foreign_message_;
  (this->field_0)._impl_.optional_foreign_message_ = (ForeignMessage *)0x0;
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    return this_00;
  }
  if (this_00 == (ForeignMessage *)0x0) {
    this_01 = (ForeignMessage *)0x0;
  }
  else {
    this_01 = (ForeignMessage *)google::protobuf::MessageLite::New((MessageLite *)this_00);
    google::protobuf::MessageLite::CheckTypeAndMergeFrom
              ((MessageLite *)this_01,(MessageLite *)this_00);
  }
  return this_01;
}

Assistant:

TestAllTypes::release_optional_foreign_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);

  _impl_._has_bits_[0] &= ~0x00000040u;
  ::proto2_unittest::ForeignMessage* released = _impl_.optional_foreign_message_;
  _impl_.optional_foreign_message_ = nullptr;
  if (::google::protobuf::internal::DebugHardenForceCopyInRelease()) {
    auto* old = reinterpret_cast<::google::protobuf::MessageLite*>(released);
    released = ::google::protobuf::internal::DuplicateIfNonNull(released);
    if (GetArena() == nullptr) {
      delete old;
    }
  } else {
    if (GetArena() != nullptr) {
      released = ::google::protobuf::internal::DuplicateIfNonNull(released);
    }
  }
  return released;
}